

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImPlotPoint ValueGetter::getValue<float,unsigned_long>(void *data,int idx)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double y;
  double x;
  ValueGetter *this_;
  int idx_local;
  void *data_local;
  
  uVar1 = *(undefined8 *)(*(long *)((long)data + 0x90) + (long)idx * 8);
  auVar2._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar2._0_8_ = uVar1;
  auVar2._12_4_ = 0x45300000;
  ImPlotPoint::ImPlotPoint
            ((ImPlotPoint *)&data_local,
             (double)*(float *)(*(long *)((long)data + 8) + (long)idx * 4),
             (auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  return _data_local;
}

Assistant:

static ImPlotPoint getValue(void* data, int idx) {
    const auto* this_ = static_cast<ValueGetter*>(data);
    double x, y;
    if constexpr (std::is_void<X>::value) {
      x = static_cast<double>(idx);
    } else {
      x = static_cast<double>((static_cast<X*>(this_->infoX.ptr))[idx]);
    }
    y = static_cast<double>((static_cast<Y*>(this_->infoY.ptr))[idx]);
    return ImPlotPoint(x, y);
  }